

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::MVNParameter::InternalSerializeWithCachedSizesToArray
          (MVNParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  void *pvVar4;
  uint8 *puVar5;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 2) != 0) {
    bVar2 = this->normalize_variance_;
    *target = '\b';
    target[1] = bVar2;
    target = target + 2;
  }
  if ((uVar3 & 1) != 0) {
    bVar2 = this->across_channels_;
    *target = '\x10';
    target[1] = bVar2;
    target = target + 2;
  }
  if ((uVar3 & 4) != 0) {
    fVar1 = this->eps_;
    *target = '\x1d';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return target;
  }
  puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
  return puVar5;
}

Assistant:

::google::protobuf::uint8* MVNParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.MVNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool normalize_variance = 1 [default = true];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(1, this->normalize_variance(), target);
  }

  // optional bool across_channels = 2 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->across_channels(), target);
  }

  // optional float eps = 3 [default = 1e-09];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->eps(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.MVNParameter)
  return target;
}